

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readpsm.c
# Opt level: O0

int dumb_get_psm_subsong_count(DUMBFILE *f)

{
  int32 iVar1;
  int32 iVar2;
  int iVar3;
  DUMBFILE *in_RDI;
  int32 l;
  int subsongs;
  int length;
  DUMBFILE *in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffe0;
  int local_4;
  
  iVar1 = dumbfile_mgetl(in_stack_ffffffffffffffd8);
  if (iVar1 == 0x50534d20) {
    iVar1 = dumbfile_igetl(in_stack_ffffffffffffffd8);
    iVar2 = dumbfile_mgetl(in_stack_ffffffffffffffd8);
    if (iVar2 == 0x46494c45) {
      local_4 = 0;
      while( true ) {
        in_stack_ffffffffffffffe0 = in_stack_ffffffffffffffe0 & 0xffffff;
        if (7 < iVar1) {
          iVar3 = dumbfile_error(in_RDI);
          in_stack_ffffffffffffffe0 =
               CONCAT13(iVar3 != 0,(int3)in_stack_ffffffffffffffe0) ^ 0xff000000;
        }
        if ((in_stack_ffffffffffffffe0 & 0x1000000) == 0) break;
        iVar2 = dumbfile_mgetl(in_stack_ffffffffffffffd8);
        if (iVar2 == 0x534f4e47) {
          local_4 = local_4 + 1;
        }
        iVar2 = dumbfile_igetl(in_stack_ffffffffffffffd8);
        dumbfile_skip((DUMBFILE *)CONCAT44(iVar1,local_4),CONCAT44(iVar2,in_stack_ffffffffffffffe0))
        ;
        iVar1 = iVar1 - (iVar2 + 8);
      }
      iVar3 = dumbfile_error(in_RDI);
      if (iVar3 != 0) {
        local_4 = 0;
      }
    }
    else {
      local_4 = 0;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int DUMBEXPORT dumb_get_psm_subsong_count(DUMBFILE *f) {
	int length, subsongs;
	int32 l;
	
	if (dumbfile_mgetl(f) != DUMB_ID('P','S','M',' ')) return 0;

	length = dumbfile_igetl(f);

	if (dumbfile_mgetl(f) != DUMB_ID('F','I','L','E')) return 0;

	subsongs = 0;

	while (length >= 8 && !dumbfile_error(f)) {
		if (dumbfile_mgetl(f) == DUMB_ID('S','O','N','G')) subsongs++;
		l = dumbfile_igetl(f);
		dumbfile_skip(f, l);
		length -= l + 8;
	}

	if (dumbfile_error(f)) return 0;

	return subsongs;
}